

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSpectra.cpp
# Opt level: O0

double TestSpectra::DD_spectrum
                 (double xMin,double xMax,double expFall,double peakFrac,double peakMu,
                 double peakSig,double peakSkew)

{
  value_type vVar1;
  initializer_list<double> __l;
  pointer yMax_00;
  RandomGen *pRVar2;
  reference pvVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  vector<double,_std::allocator<double>_> local_c8;
  double local_b0;
  double FuncValue;
  allocator<double> local_91;
  double local_90;
  double local_88;
  undefined8 local_80;
  iterator local_78;
  size_type local_70;
  undefined1 local_68 [8];
  vector<double,_std::allocator<double>_> xyTry;
  double yMax;
  double yMin;
  double peakSkew_local;
  double peakSig_local;
  double peakMu_local;
  double peakFrac_local;
  double expFall_local;
  double xMax_local;
  double xMin_local;
  
  expFall_local = xMax;
  if (80.0 < xMax) {
    expFall_local = 80.0;
  }
  xMax_local = xMin;
  if (xMin < 0.0) {
    xMax_local = 0.0;
  }
  xyTry.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x3ff0000000000000;
  if (peakMu < expFall_local) {
    xyTry.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)(peakFrac + 1.0);
  }
  pRVar2 = RandomGen::rndm();
  dVar4 = RandomGen::rand_uniform(pRVar2);
  local_90 = (expFall_local - xMax_local) * dVar4 + xMax_local;
  dVar4 = (double)xyTry.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage - 0.0;
  pRVar2 = RandomGen::rndm();
  dVar5 = RandomGen::rand_uniform(pRVar2);
  local_88 = dVar4 * dVar5 + 0.0;
  local_80 = 0x3ff0000000000000;
  local_78 = &local_90;
  local_70 = 3;
  std::allocator<double>::allocator(&local_91);
  __l._M_len = local_70;
  __l._M_array = local_78;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_68,__l,&local_91);
  std::allocator<double>::~allocator(&local_91);
  while( true ) {
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_68,2);
    if (*pvVar3 <= 0.0) break;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_68,0);
    dVar4 = exp(-*pvVar3 / expFall);
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_68,0);
    dVar5 = pow((*pvVar3 - peakMu) / peakSig,2.0);
    dVar5 = exp(-dVar5);
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_68,0);
    dVar6 = erf((peakSkew * (*pvVar3 - peakMu)) / peakSig);
    local_b0 = peakFrac * dVar5 * (dVar6 + 1.0) + dVar4;
    pRVar2 = RandomGen::rndm();
    yMax_00 = xyTry.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_68,0);
    dVar4 = *pvVar3;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_68,1);
    RandomGen::VonNeumann
              (&local_c8,pRVar2,xMax_local,expFall_local,0.0,(double)yMax_00,dVar4,*pvVar3,local_b0)
    ;
    std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)local_68,&local_c8);
    std::vector<double,_std::allocator<double>_>::~vector(&local_c8);
  }
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_68,0);
  vVar1 = *pvVar3;
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_68);
  return vVar1;
}

Assistant:

double TestSpectra::DD_spectrum(double xMin, double xMax, double expFall,
                                double peakFrac, double peakMu,
                                double peakSig, double peakSkew) {
  // JV LUX, most closely like JENDL-4. See arXiv:1608.05381. Lower than
  // G4/LUXSim
  if (xMax > 80.) xMax = 80.;
  if (xMin < 0.000) xMin = 0.000;
  double yMin = 0.0;
  double yMax = 1.; if ( peakMu < xMax ) yMax += peakFrac;
  vector<double> xyTry = {
      xMin + (xMax - xMin) * RandomGen::rndm()->rand_uniform(),
      yMin + (yMax - yMin) * RandomGen::rndm()->rand_uniform(), 1.};
  while (xyTry[2] > 0.) {
    double FuncValue = exp(-xyTry[0] / expFall) +
                       peakFrac * exp(-pow((xyTry[0] - peakMu) / peakSig, 2.))*(erf(peakSkew*(xyTry[0] - peakMu) / peakSig)+1);
    xyTry = RandomGen::rndm()->VonNeumann(xMin, xMax, yMin, yMax, xyTry[0],
                                          xyTry[1], FuncValue);
  }
  return xyTry[0];
}